

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

int AF_AActor_A_NoBlocking
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  AActor *self;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      self = (AActor *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (self == (AActor *)0x0) goto LAB_004a6a9c;
        bVar1 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004a6aeb;
        }
      }
      else {
        if (self != (AActor *)0x0) goto LAB_004a6adb;
LAB_004a6a9c:
        self = (AActor *)0x0;
      }
      if (numparam == 1) {
        param = defaultparam->Array;
        if (param[1].field_0.field_3.Type == '\0') {
LAB_004a6abc:
          A_Unblock(self,param[1].field_0.i != 0);
          return 0;
        }
        __assertion = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') goto LAB_004a6abc;
        __assertion = "(param[paramnum]).Type == REGT_INT";
      }
      __line = 0x48;
      goto LAB_004a6b14;
    }
LAB_004a6adb:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004a6aeb:
  __line = 0x47;
LAB_004a6b14:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,__line,
                "int AF_AActor_A_NoBlocking(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_NoBlocking)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(drop);
	A_Unblock(self, drop);
	return 0;
}